

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O1

int st__gen(st__generator *gen,char **key_p,char **value_p)

{
  int iVar1;
  int iVar2;
  st__table_entry *psVar3;
  long lVar4;
  
  if (gen->entry == (st__table_entry *)0x0) {
    iVar1 = gen->index;
    iVar2 = gen->table->num_bins;
    if (iVar1 < iVar2) {
      lVar4 = 0;
      do {
        psVar3 = gen->table->bins[iVar1 + lVar4];
        if (psVar3 != (st__table_entry *)0x0) {
          gen->index = iVar1 + (int)lVar4 + 1;
          gen->entry = psVar3;
          break;
        }
        lVar4 = lVar4 + 1;
      } while ((long)iVar2 - (long)iVar1 != lVar4);
    }
    if (gen->entry == (st__table_entry *)0x0) {
      return 0;
    }
  }
  *key_p = gen->entry->key;
  if (value_p != (char **)0x0) {
    *value_p = gen->entry->record;
  }
  gen->entry = gen->entry->next;
  return 1;
}

Assistant:

int 
 st__gen( st__generator *gen, const char **key_p, char **value_p)
{
    int i;

    if (gen->entry == NULL) {
    /* try to find next entry */
    for(i = gen->index; i < gen->table->num_bins; i++) {
        if (gen->table->bins[i] != NULL) {
        gen->index = i+1;
        gen->entry = gen->table->bins[i];
        break;
        }
    }
    if (gen->entry == NULL) {
        return 0;       /* that's all folks ! */
    }
    }
    *key_p = gen->entry->key;
    if (value_p != 0) {
    *value_p = gen->entry->record;
    }
    gen->entry = gen->entry->next;
    return 1;
}